

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test_cases.cpp
# Opt level: O2

void anon_unknown.dwarf_1bd4e7::check(pbf_reader message)

{
  StringRef capturedExpression;
  bool bVar1;
  int32_t iVar2;
  data_view dVar3;
  string local_178;
  undefined1 local_158 [16];
  pbf_reader local_148;
  BinaryExpr<const_char_(&)[7],_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  undefined1 local_100 [16];
  pbf_reader local_f0;
  StringRef local_d8;
  StringRef local_c8;
  StringRef local_b8;
  StringRef local_a8;
  StringRef local_98;
  StringRef local_88;
  AssertionHandler catchAssertionHandler;
  
  do {
    while( true ) {
      bVar1 = protozero::pbf_reader::next(&message);
      if (!bVar1) {
        return;
      }
      if (message.m_tag != 2) break;
      local_130.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1d7976;
      local_130.super_ITransientExpression.m_isBinaryExpression = true;
      local_130.super_ITransientExpression.m_result = false;
      local_130.super_ITransientExpression._10_6_ = 0;
      local_178._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
      ;
      local_178._M_string_length = 0x34;
      Catch::StringRef::StringRef(&local_c8,"77 == message.get_int32()");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_130,(SourceLineInfo *)&local_178,
                 local_c8,Normal);
      local_f0.m_data = (char *)CONCAT44(local_f0.m_data._4_4_,0x4d);
      local_178._M_dataplus._M_p = (pointer)&local_f0;
      iVar2 = protozero::pbf_reader::get_int32(&message);
      local_148.m_data = (char *)CONCAT44(local_148.m_data._4_4_,iVar2);
      Catch::ExprLhs<int_const&>::operator==
                ((BinaryExpr<const_int_&,_const_int_&> *)&local_130,
                 (ExprLhs<int_const&> *)&local_178,(int *)&local_148);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_130.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_130.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
LAB_0017476e:
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    if (message.m_tag != 1) {
      local_130.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1d7976;
      local_130.super_ITransientExpression.m_isBinaryExpression = true;
      local_130.super_ITransientExpression.m_result = false;
      local_130.super_ITransientExpression._10_6_ = 0;
      local_178._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
      ;
      local_178._M_string_length = 0x38;
      Catch::StringRef::StringRef(&local_d8,"false");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_130,(SourceLineInfo *)&local_178,
                 local_d8,Normal);
      local_130.super_ITransientExpression._vptr_ITransientExpression =
           (_func_int **)
           ((ulong)local_130.super_ITransientExpression._vptr_ITransientExpression &
           0xffffffffffffff00);
      Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_130);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      goto LAB_0017476e;
    }
    dVar3 = protozero::pbf_reader::get_view(&message);
    local_148.m_data = dVar3.m_data;
    local_148.m_end = local_148.m_data + dVar3.m_size;
    local_148.m_wire_type = unknown;
    local_148.m_tag = 0;
    while (bVar1 = protozero::pbf_reader::next(&local_148), bVar1) {
      if (local_148.m_tag == 2) {
        local_130.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1d7976;
        local_130.super_ITransientExpression.m_isBinaryExpression = true;
        local_130.super_ITransientExpression.m_result = false;
        local_130.super_ITransientExpression._10_6_ = 0;
        local_178._M_dataplus._M_p =
             "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
        ;
        local_178._M_string_length = 0x21;
        Catch::StringRef::StringRef(&local_a8,"88 == message.get_int32()");
        Catch::AssertionHandler::AssertionHandler
                  (&catchAssertionHandler,(StringRef *)&local_130,(SourceLineInfo *)&local_178,
                   local_a8,Normal);
        local_f0.m_data = (char *)CONCAT44(local_f0.m_data._4_4_,0x58);
        local_178._M_dataplus._M_p = (pointer)&local_f0;
        local_100._0_4_ = protozero::pbf_reader::get_int32(&local_148);
        Catch::ExprLhs<int_const&>::operator==
                  ((BinaryExpr<const_int_&,_const_int_&> *)&local_130,
                   (ExprLhs<int_const&> *)&local_178,(int *)local_100);
        Catch::AssertionHandler::handleExpr
                  (&catchAssertionHandler,&local_130.super_ITransientExpression);
        Catch::ITransientExpression::~ITransientExpression(&local_130.super_ITransientExpression);
        Catch::AssertionHandler::complete(&catchAssertionHandler);
LAB_00174601:
        Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      }
      else {
        if (local_148.m_tag != 1) {
          local_130.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1d7976;
          local_130.super_ITransientExpression.m_isBinaryExpression = true;
          local_130.super_ITransientExpression.m_result = false;
          local_130.super_ITransientExpression._10_6_ = 0;
          local_178._M_dataplus._M_p =
               "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
          ;
          local_178._M_string_length = 0x25;
          Catch::StringRef::StringRef(&local_b8,"false");
          Catch::AssertionHandler::AssertionHandler
                    (&catchAssertionHandler,(StringRef *)&local_130,(SourceLineInfo *)&local_178,
                     local_b8,Normal);
          local_130.super_ITransientExpression._vptr_ITransientExpression =
               (_func_int **)
               ((ulong)local_130.super_ITransientExpression._vptr_ITransientExpression &
               0xffffffffffffff00);
          Catch::AssertionHandler::handleExpr<bool>
                    (&catchAssertionHandler,(ExprLhs<bool> *)&local_130);
          Catch::AssertionHandler::complete(&catchAssertionHandler);
          goto LAB_00174601;
        }
        dVar3 = protozero::pbf_reader::get_view(&local_148);
        local_f0.m_data = dVar3.m_data;
        local_f0.m_end = local_f0.m_data + dVar3.m_size;
        local_f0.m_wire_type = unknown;
        local_f0.m_tag = 0;
        while (bVar1 = protozero::pbf_reader::next(&local_f0), bVar1) {
          if (local_f0.m_tag == 2) {
            local_130.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1d7976
            ;
            local_130.super_ITransientExpression.m_isBinaryExpression = true;
            local_130.super_ITransientExpression.m_result = false;
            local_130.super_ITransientExpression._10_6_ = 0;
            local_178._M_dataplus._M_p =
                 "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
            ;
            local_178._M_string_length = 0xe;
            Catch::StringRef::StringRef(&local_88,"99 == message.get_int32()");
            Catch::AssertionHandler::AssertionHandler
                      (&catchAssertionHandler,(StringRef *)&local_130,(SourceLineInfo *)&local_178,
                       local_88,Normal);
            local_158._0_4_ = 99;
            local_178._M_dataplus._M_p = local_158;
            local_158._12_4_ = protozero::pbf_reader::get_int32(&local_f0);
            Catch::ExprLhs<int_const&>::operator==
                      ((BinaryExpr<const_int_&,_const_int_&> *)&local_130,
                       (ExprLhs<int_const&> *)&local_178,(int *)(local_158 + 0xc));
            Catch::AssertionHandler::handleExpr
                      (&catchAssertionHandler,&local_130.super_ITransientExpression);
            Catch::ITransientExpression::~ITransientExpression
                      (&local_130.super_ITransientExpression);
            Catch::AssertionHandler::complete(&catchAssertionHandler);
          }
          else if (local_f0.m_tag == 1) {
            local_130.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1d7976
            ;
            local_130.super_ITransientExpression.m_isBinaryExpression = true;
            local_130.super_ITransientExpression.m_result = false;
            local_130.super_ITransientExpression._10_6_ = 0;
            local_178._M_dataplus._M_p =
                 "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
            ;
            local_178._M_string_length = 10;
            Catch::StringRef::StringRef((StringRef *)local_100,"\"foobar\" == message.get_string()")
            ;
            capturedExpression._4_12_ = local_100._4_12_;
            capturedExpression.m_start._0_4_ = local_100._0_4_;
            Catch::AssertionHandler::AssertionHandler
                      (&catchAssertionHandler,(StringRef *)&local_130,(SourceLineInfo *)&local_178,
                       capturedExpression,Normal);
            local_158._0_8_ = "foobar";
            protozero::pbf_reader::get_string_abi_cxx11_(&local_178,&local_f0);
            Catch::ExprLhs<char_const(&)[7]>::operator==
                      (&local_130,(ExprLhs<char_const(&)[7]> *)local_158,&local_178);
            Catch::AssertionHandler::handleExpr
                      (&catchAssertionHandler,&local_130.super_ITransientExpression);
            Catch::ITransientExpression::~ITransientExpression
                      (&local_130.super_ITransientExpression);
            std::__cxx11::string::~string((string *)&local_178);
            Catch::AssertionHandler::complete(&catchAssertionHandler);
          }
          else {
            local_130.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1d7976
            ;
            local_130.super_ITransientExpression.m_isBinaryExpression = true;
            local_130.super_ITransientExpression.m_result = false;
            local_130.super_ITransientExpression._10_6_ = 0;
            local_178._M_dataplus._M_p =
                 "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/nested/reader_test_cases.cpp"
            ;
            local_178._M_string_length = 0x12;
            Catch::StringRef::StringRef(&local_98,"false");
            Catch::AssertionHandler::AssertionHandler
                      (&catchAssertionHandler,(StringRef *)&local_130,(SourceLineInfo *)&local_178,
                       local_98,Normal);
            local_130.super_ITransientExpression._vptr_ITransientExpression =
                 (_func_int **)
                 ((ulong)local_130.super_ITransientExpression._vptr_ITransientExpression &
                 0xffffffffffffff00);
            Catch::AssertionHandler::handleExpr<bool>
                      (&catchAssertionHandler,(ExprLhs<bool> *)&local_130);
            Catch::AssertionHandler::complete(&catchAssertionHandler);
          }
          Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
        }
      }
    }
  } while( true );
}

Assistant:

void check(protozero::pbf_reader message) {
    while (message.next()) {
        switch (message.tag()) {
            case 1: {
                check_sub(message.get_message());
                break;
            }
            case 2: {
                REQUIRE(77 == message.get_int32());
                break;
            }
            default: {
                REQUIRE(false); // should never be here
                break;
            }
        }
    }
}